

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  ostream *poVar1;
  int iVar2;
  __pid_t _Var3;
  size_t sVar4;
  int *piVar5;
  undefined8 *puVar6;
  long *plVar7;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 extraout_RAX_01;
  long *plVar8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *pcVar12;
  undefined8 uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  int pipe_fd [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_140;
  long local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  string local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  long local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  int local_80;
  int local_7c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  undefined8 local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_54;
  string local_50;
  
  sVar4 = GetThreadCount();
  if (sVar4 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_120,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       ,0x462);
    Message::Message((Message *)&local_c0);
    _Var9._M_head_impl = local_c0._M_head_impl;
    poVar1 = (ostream *)(local_c0._M_head_impl + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (sVar4 == 0) {
      lVar15 = 0x26;
      pcVar12 = "couldn\'t detect the number of threads.";
    }
    else {
      lVar15 = 9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar12 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar12,lVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               " See https://github.com/google/googletest/blob/master/googletest/docs/advanced.md#death-tests-and-threads"
               ,0x69);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," this is the last message you see before your test times out.",0x3d);
    StringStreamToString(&local_100,_Var9._M_head_impl);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var9._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)_Var9._M_head_impl + 8))(_Var9._M_head_impl);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_100._M_dataplus._M_p,local_100._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    GTestLog::~GTestLog((GTestLog *)&local_120);
  }
  iVar2 = pipe(&local_80);
  if (iVar2 == -1) {
    paVar17 = &local_68;
    local_78 = paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CHECK failed: File ","");
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
    paVar18 = &local_d0;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar6;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if (local_e0 == paVar14) {
      local_d0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_d0._8_8_ = puVar6[3];
      local_e0 = paVar18;
    }
    else {
      local_d0._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_d8 = puVar6[1];
    *puVar6 = paVar14;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    paVar14 = &local_130;
    local_140._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_head_impl == paVar16) {
      local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_130._8_8_ = puVar6[3];
      local_140._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar14;
    }
    else {
      local_130._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_138 = puVar6[1];
    *puVar6 = paVar16;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_50._M_dataplus._M_p._0_4_ = 0x466;
    StreamableToString<int>(&local_a0,(int *)&local_50);
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_head_impl != paVar14) {
      uVar13 = local_130._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_a0._M_string_length + local_138) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar13 = local_a0.field_2._M_allocated_capacity;
      }
      _Var9._M_head_impl = local_140._M_head_impl;
      if (local_a0._M_string_length + local_138 <= (ulong)uVar13) goto LAB_0012a03b;
    }
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_a0._M_dataplus._M_p);
LAB_0012a04c:
    local_120 = (long *)*puVar6;
    plVar7 = puVar6 + 2;
    if (local_120 == plVar7) {
      local_110 = *plVar7;
      lStack_108 = puVar6[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *plVar7;
    }
    local_118 = puVar6[1];
    *puVar6 = plVar7;
    puVar6[1] = 0;
    *(undefined1 *)plVar7 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
    paVar16 = &local_b0;
    local_c0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_head_impl == paVar11) {
      local_b0._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_b0._8_8_ = puVar6[3];
      local_c0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar16;
    }
    else {
      local_b0._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_b8 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
    paVar11 = &local_100.field_2;
    local_100._M_dataplus._M_p = (pointer)*puVar6;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == paVar10) {
      local_100.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_100.field_2._8_8_ = puVar6[3];
      local_100._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_100.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_100._M_string_length = puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    DeathTestAbort(&local_100);
    puVar6 = extraout_RAX_00;
    local_100._M_dataplus._M_p = (pointer)extraout_RDX_00;
  }
  else {
    paVar17 = &local_100.field_2;
    local_100._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar17) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var3 = fork();
    if (_Var3 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var3;
      if (_Var3 == 0) {
        do {
          iVar2 = close(local_80);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_7c;
            UnitTest::GetInstance();
            (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
                 false;
            g_in_fast_death_test_child = 1;
            return EXECUTE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"CHECK failed: File ","");
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_78 == paVar18) {
          local_68._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_68._8_8_ = puVar6[3];
          local_78 = &local_68;
        }
        else {
          local_68._M_allocated_capacity = paVar18->_M_allocated_capacity;
        }
        local_70 = puVar6[1];
        *puVar6 = paVar18;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
        local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_e0 == paVar18) {
          local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_d0._8_8_ = puVar6[3];
          local_e0 = &local_d0;
        }
        else {
          local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
        }
        local_d8 = puVar6[1];
        *puVar6 = paVar18;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        local_54 = 0x477;
        StreamableToString<int>(&local_50,&local_54);
        uVar13 = 0xf;
        if (local_e0 != &local_d0) {
          uVar13 = local_d0._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_50._M_string_length + local_d8) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
              &local_50.field_2) {
            uVar13 = local_50.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_50._M_string_length + local_d8) goto LAB_00129b1a;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_e0);
        }
        else {
LAB_00129b1a:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e0,
                              (ulong)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                              local_50._M_dataplus._M_p._0_4_));
        }
        local_140._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_head_impl == paVar18) {
          local_130._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_130._8_8_ = puVar6[3];
          local_140._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130
          ;
        }
        else {
          local_130._M_allocated_capacity = paVar18->_M_allocated_capacity;
        }
        local_138 = puVar6[1];
        *puVar6 = paVar18;
        puVar6[1] = 0;
        paVar18->_M_local_buf[0] = '\0';
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_140);
        local_120 = (long *)*puVar6;
        plVar7 = puVar6 + 2;
        if (local_120 == plVar7) {
          local_110 = *plVar7;
          lStack_108 = puVar6[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *plVar7;
        }
        local_118 = puVar6[1];
        *puVar6 = plVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
        local_c0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_head_impl == paVar18) {
          local_b0._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_b0._8_8_ = puVar6[3];
          local_c0._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
        }
        else {
          local_b0._M_allocated_capacity = paVar18->_M_allocated_capacity;
        }
        local_b8 = puVar6[1];
        *puVar6 = paVar18;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
        local_100._M_dataplus._M_p = (pointer)*puVar6;
        _Var9._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar6 + 2)
        ;
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_100._M_dataplus._M_p != _Var9._M_head_impl) goto LAB_0012a00d;
        local_100.field_2._M_allocated_capacity = *(undefined8 *)_Var9._M_head_impl;
        local_100.field_2._8_8_ = puVar6[3];
        local_100._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        do {
          iVar2 = close(local_7c);
          if (iVar2 != -1) {
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_80;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            return OVERSEE_TEST;
          }
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"CHECK failed: File ","");
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_78 == paVar18) {
          local_68._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_68._8_8_ = puVar6[3];
          local_78 = &local_68;
        }
        else {
          local_68._M_allocated_capacity = paVar18->_M_allocated_capacity;
        }
        local_70 = puVar6[1];
        *puVar6 = paVar18;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
        local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar6;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if (local_e0 == paVar18) {
          local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_d0._8_8_ = puVar6[3];
          local_e0 = &local_d0;
        }
        else {
          local_d0._M_allocated_capacity = paVar18->_M_allocated_capacity;
        }
        local_d8 = puVar6[1];
        *puVar6 = paVar18;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        local_54 = 0x483;
        StreamableToString<int>(&local_50,&local_54);
        uVar13 = 0xf;
        if (local_e0 != &local_d0) {
          uVar13 = local_d0._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_50._M_string_length + local_d8) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
              &local_50.field_2) {
            uVar13 = local_50.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_50._M_string_length + local_d8) goto LAB_001299ae;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_e0);
        }
        else {
LAB_001299ae:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_e0,
                              (ulong)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                              local_50._M_dataplus._M_p._0_4_));
        }
        local_140._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_head_impl == paVar18) {
          local_130._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_130._8_8_ = puVar6[3];
          local_140._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130
          ;
        }
        else {
          local_130._M_allocated_capacity = paVar18->_M_allocated_capacity;
        }
        local_138 = puVar6[1];
        *puVar6 = paVar18;
        puVar6[1] = 0;
        paVar18->_M_local_buf[0] = '\0';
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_140);
        local_120 = (long *)*plVar7;
        plVar8 = plVar7 + 2;
        if (local_120 == plVar8) {
          local_110 = *plVar8;
          lStack_108 = plVar7[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *plVar8;
        }
        local_118 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_120);
        local_c0._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar7;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_head_impl == paVar18) {
          local_b0._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_b0._8_8_ = plVar7[3];
          local_c0._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
        }
        else {
          local_b0._M_allocated_capacity = paVar18->_M_allocated_capacity;
        }
        local_b8 = plVar7[1];
        *plVar7 = (long)paVar18;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
        local_100._M_dataplus._M_p = (pointer)*puVar6;
        _Var9._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar6 + 2)
        ;
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_100._M_dataplus._M_p == _Var9._M_head_impl) {
          local_100.field_2._M_allocated_capacity = *(undefined8 *)_Var9._M_head_impl;
          local_100.field_2._8_8_ = puVar6[3];
          local_100._M_dataplus._M_p = (pointer)paVar17;
        }
        else {
          local_100.field_2._M_allocated_capacity = *(undefined8 *)_Var9._M_head_impl;
        }
        local_100._M_string_length = puVar6[1];
        *puVar6 = _Var9._M_head_impl;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        DeathTestAbort(&local_100);
        puVar6 = extraout_RAX;
        local_100._M_dataplus._M_p = (pointer)extraout_RDX;
LAB_0012a00d:
        local_100.field_2._M_allocated_capacity = *(undefined8 *)_Var9._M_head_impl;
      }
      paVar18 = &local_a0.field_2;
      paVar14 = &local_68;
      local_100._M_string_length = puVar6[1];
      *puVar6 = _Var9._M_head_impl;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      DeathTestAbort(&local_100);
LAB_0012a03b:
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_a0,0,(char *)0x0,(ulong)_Var9._M_head_impl);
      goto LAB_0012a04c;
    }
    paVar18 = &local_68;
    local_78 = paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CHECK failed: File ","");
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
    paVar14 = &local_d0;
    local_e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar6;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if (local_e0 == paVar16) {
      local_d0._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_d0._8_8_ = puVar6[3];
      local_e0 = paVar14;
    }
    else {
      local_d0._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_d8 = puVar6[1];
    *puVar6 = paVar16;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    paVar16 = &local_130;
    local_140._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_head_impl == paVar11) {
      local_130._M_allocated_capacity = paVar11->_M_allocated_capacity;
      local_130._8_8_ = puVar6[3];
      local_140._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar16;
    }
    else {
      local_130._M_allocated_capacity = paVar11->_M_allocated_capacity;
    }
    local_138 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_50._M_dataplus._M_p._0_4_ = 0x474;
    StreamableToString<int>(&local_a0,(int *)&local_50);
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_head_impl != paVar16) {
      uVar13 = local_130._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_a0._M_string_length + local_138) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar13 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_a0._M_string_length + local_138) goto LAB_00129f75;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_a0,0,(char *)0x0,(ulong)local_140._M_head_impl);
    }
    else {
LAB_00129f75:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_a0._M_dataplus._M_p);
    }
    local_120 = (long *)*puVar6;
    plVar7 = puVar6 + 2;
    if (local_120 == plVar7) {
      local_110 = *plVar7;
      lStack_108 = puVar6[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *plVar7;
    }
    local_118 = puVar6[1];
    *puVar6 = plVar7;
    puVar6[1] = 0;
    *(undefined1 *)plVar7 = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_120);
    paVar11 = &local_b0;
    local_c0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar6;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_head_impl == paVar10) {
      local_b0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_b0._8_8_ = puVar6[3];
      local_c0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)paVar11;
    }
    else {
      local_b0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_b8 = puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
    local_100._M_dataplus._M_p = (pointer)*puVar6;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p == paVar10) {
      local_100.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_100.field_2._8_8_ = puVar6[3];
      local_100._M_dataplus._M_p = (pointer)paVar17;
      goto LAB_0012a252;
    }
  }
  local_100.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
LAB_0012a252:
  local_100._M_string_length = puVar6[1];
  *puVar6 = paVar10;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  DeathTestAbort(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar17) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_head_impl != paVar11) {
    operator_delete(local_c0._M_head_impl);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_head_impl != paVar16) {
    operator_delete(local_140._M_head_impl);
  }
  if (local_e0 != paVar14) {
    operator_delete(local_e0);
  }
  if (local_78 != paVar18) {
    operator_delete(local_78);
  }
  _Unwind_Resume(extraout_RAX_01);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}